

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.c
# Opt level: O3

void tok_wfinish(TokenizerW *tok)

{
  wchar_t wVar1;
  wchar_t *pwVar2;
  size_t sVar3;
  
  pwVar2 = tok->wptr;
  *pwVar2 = L'\0';
  wVar1 = tok->flags;
  if ((wVar1 & 1U) != 0 || pwVar2 != tok->wstart) {
    sVar3 = tok->argc;
    tok->argc = sVar3 + 1;
    tok->argv[sVar3] = tok->wstart;
    tok->argv[sVar3 + 1] = (wchar_t *)0x0;
    pwVar2 = tok->wptr;
    tok->wptr = pwVar2 + 1;
    tok->wstart = pwVar2 + 1;
  }
  tok->flags = wVar1 & 0xfffffffe;
  return;
}

Assistant:

static void
FUN(tok,finish)(TYPE(Tokenizer) *tok)
{

	*tok->wptr = '\0';
	if ((tok->flags & TOK_KEEP) || tok->wptr != tok->wstart) {
		tok->argv[tok->argc++] = tok->wstart;
		tok->argv[tok->argc] = NULL;
		tok->wstart = ++tok->wptr;
	}
	tok->flags &= ~TOK_KEEP;
}